

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  uint uVar1;
  uint uVar2;
  uint in_EDX;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImVec2 next_scroll;
  float target_y;
  float target_x;
  bool can_be_fully_visible_y;
  bool can_be_fully_visible_x;
  bool fully_visible_y;
  bool fully_visible_x;
  ImGuiScrollFlags in_flags;
  ImRect window_rect;
  ImGuiContext *g;
  ImVec2 delta_scroll;
  ImVec2 *in_stack_ffffffffffffff08;
  ImVec2 *lhs;
  ImGuiWindow *in_stack_ffffffffffffff10;
  float local_d8;
  float local_d0;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 uVar7;
  undefined1 uVar8;
  ImVec2 local_98;
  ImVec2 local_90;
  ImRect local_88;
  ImVec2 local_78;
  ImVec2 local_70;
  float local_68;
  float local_64;
  byte local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  uint local_5c;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImRect local_38;
  ImGuiContext *pIVar9;
  ImGuiScrollFlags flags_00;
  undefined4 in_stack_ffffffffffffffe0;
  ImVec2 local_8;
  
  pIVar9 = GImGui;
  ImVec2::ImVec2(&local_48,1.0,1.0);
  local_40 = operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x12f062);
  ImVec2::ImVec2(&local_58,1.0,1.0);
  local_50 = operator+(in_stack_ffffffffffffff08,(ImVec2 *)0x12f0a8);
  local_5c = in_EDX;
  ImRect::ImRect(&local_38,&local_40,&local_50);
  uVar1 = local_5c;
  if (((local_5c & 0x15) == 0) && ((in_RDI->ScrollbarX & 1U) != 0)) {
    uVar1 = local_5c | 1;
  }
  if ((uVar1 & 0x2a) == 0) {
    uVar2 = 2;
    if ((in_RDI->Appearing & 1U) != 0) {
      uVar2 = 0x20;
    }
    uVar1 = uVar2 | uVar1;
  }
  uVar8 = false;
  if (local_38.Min.x <= ((ImVec2 *)&in_RSI->Name)->x) {
    uVar8 = ((ImVec2 *)&in_RSI->ID)->x <= local_38.Max.x;
  }
  uVar7 = false;
  if (local_38.Min.y <= ((ImVec2 *)&in_RSI->Name)->y) {
    uVar7 = (float)in_RSI->Flags <= local_38.Max.y;
  }
  local_5e = uVar7;
  local_5d = uVar8;
  fVar3 = ImRect::GetWidth((ImRect *)in_RSI);
  fVar5 = (pIVar9->Style).ItemSpacing.x;
  fVar4 = ImRect::GetWidth(&local_38);
  local_5f = fVar5 + fVar5 + fVar3 <= fVar4;
  fVar3 = ImRect::GetHeight((ImRect *)in_RSI);
  fVar5 = (pIVar9->Style).ItemSpacing.y;
  fVar3 = fVar5 + fVar5 + fVar3;
  fVar5 = ImRect::GetHeight(&local_38);
  local_60 = fVar3 <= fVar5;
  if (((uVar1 & 1) == 0) || ((local_5d & 1) != 0)) {
    if ((((uVar1 & 4) != 0) && ((local_5d & 1) == 0)) || ((uVar1 & 0x10) != 0)) {
      if ((local_5f & 1) == 0) {
        local_d0 = ((ImVec2 *)&in_RSI->Name)->x;
      }
      else {
        fVar5 = ((ImVec2 *)&in_RSI->Name)->x;
        fVar4 = ((ImVec2 *)&in_RSI->ID)->x;
        fVar6 = ImRect::GetWidth(&in_RDI->InnerRect);
        local_d0 = ImFloor(((fVar5 + fVar4) - fVar6) * 0.5);
      }
      local_64 = local_d0;
      SetScrollFromPosX(in_RDI,local_d0 - (in_RDI->Pos).x,0.0);
    }
    flags_00 = (ImGuiScrollFlags)((ulong)pIVar9 >> 0x20);
  }
  else if ((((ImVec2 *)&in_RSI->Name)->x < local_38.Min.x) || ((local_5f & 1) == 0)) {
    SetScrollFromPosX(in_RDI,(((ImVec2 *)&in_RSI->Name)->x - (pIVar9->Style).ItemSpacing.x) -
                             (in_RDI->Pos).x,0.0);
    flags_00 = (ImGuiScrollFlags)((ulong)pIVar9 >> 0x20);
  }
  else {
    if (local_38.Max.x <= ((ImVec2 *)&in_RSI->ID)->x) {
      SetScrollFromPosX(in_RDI,(((ImVec2 *)&in_RSI->ID)->x + (pIVar9->Style).ItemSpacing.x) -
                               (in_RDI->Pos).x,1.0);
    }
    flags_00 = (ImGuiScrollFlags)((ulong)pIVar9 >> 0x20);
  }
  if (((uVar1 & 2) == 0) || ((local_5e & 1) != 0)) {
    if ((((uVar1 & 8) != 0) && ((local_5e & 1) == 0)) || ((uVar1 & 0x20) != 0)) {
      if ((local_60 & 1) == 0) {
        local_d8 = ((ImVec2 *)&in_RSI->Name)->y;
      }
      else {
        fVar5 = ((ImVec2 *)&in_RSI->Name)->y;
        fVar4 = (float)in_RSI->Flags;
        fVar6 = ImRect::GetHeight(&in_RDI->InnerRect);
        local_d8 = ImFloor(((fVar5 + fVar4) - fVar6) * 0.5);
      }
      local_68 = local_d8;
      SetScrollFromPosY(in_stack_ffffffffffffff10,(float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                        SUB84(in_stack_ffffffffffffff08,0));
    }
  }
  else {
    fVar5 = (float)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if ((((ImVec2 *)&in_RSI->Name)->y < local_38.Min.y) || ((local_60 & 1) == 0)) {
      SetScrollFromPosY(in_stack_ffffffffffffff10,fVar5,SUB84(in_stack_ffffffffffffff08,0));
    }
    else if (local_38.Max.y <= (float)in_RSI->Flags) {
      SetScrollFromPosY(in_stack_ffffffffffffff10,fVar5,SUB84(in_stack_ffffffffffffff08,0));
    }
  }
  local_70 = CalcNextScrollFromScrollTargetAndClamp
                       ((ImGuiWindow *)
                        CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffff3c,fVar3))));
  local_8 = operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x12f618);
  if (((uVar1 & 0x40) == 0) && ((in_RDI->Flags & 0x1000000U) != 0)) {
    if ((local_5c & 0x14) != 0) {
      local_5c = local_5c & 0xffffffea | 1;
    }
    if ((local_5c & 0x28) != 0) {
      local_5c = local_5c & 0xffffffd5 | 2;
    }
    lhs = &local_8;
    local_90 = operator-(lhs,(ImVec2 *)0x12f6c0);
    local_98 = operator-(lhs,(ImVec2 *)0x12f6db);
    ImRect::ImRect(&local_88,&local_90,&local_98);
    local_78 = ScrollToRectEx(in_RSI,(ImRect *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),flags_00);
    operator+=(&local_8,&local_78);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= window_rect.Min.x && item_rect.Max.x <= window_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= window_rect.Min.y && item_rect.Max.y <= window_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= window_rect.GetWidth();
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= window_rect.GetHeight();

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < window_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        float target_x = can_be_fully_visible_x ? ImFloor((item_rect.Min.x + item_rect.Max.x - window->InnerRect.GetWidth()) * 0.5f) : item_rect.Min.x;
        SetScrollFromPosX(window, target_x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < window_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        float target_y = can_be_fully_visible_y ? ImFloor((item_rect.Min.y + item_rect.Max.y - window->InnerRect.GetHeight()) * 0.5f) : item_rect.Min.y;
        SetScrollFromPosY(window, target_y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}